

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<std::error_code_const&>::
captureExpression<(Catch::Internal::Operator)0,io::net::stream_errc>
          (ExpressionLhs<std::error_code_const&> *this,stream_errc *rhs)

{
  bool result;
  ResultBuilder *pRVar1;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  
  pRVar1 = *(ResultBuilder **)this;
  result = Internal::Evaluator<std::error_code,_io::net::stream_errc,_(Catch::Internal::Operator)0>
           ::evaluate(*(error_code **)(this + 8),rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  Detail::StringMakerBase<true>::convert<std::error_code>(&local_38,*(error_code **)(this + 8));
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Detail::StringMakerBase<true>::convert<io::net::stream_errc>(&local_58,rhs);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"==",&local_79);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }